

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf.c
# Opt level: O0

int snprintf(char *__s,size_t __maxlen,char *__format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list ap;
  int rc;
  char *format_local;
  size_t n_local;
  char *s_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x18;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  iVar1 = vsnprintf(__s,__maxlen,__format,&local_48);
  return iVar1;
}

Assistant:

int snprintf( char * _PDCLIB_restrict s, size_t n, const char * _PDCLIB_restrict format, ... )
{
    int rc;
    va_list ap;
    va_start( ap, format );
    rc = vsnprintf( s, n, format, ap );
    va_end( ap );
    return rc;
}